

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O2

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  UInt32 UVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  if (p->Range < 0x1000000) {
    UVar1 = p->Code;
    bVar2 = (*p->Stream->Read)(p->Stream);
    uVar4 = (uint)bVar2 | UVar1 << 8;
    p->Code = uVar4;
    uVar3 = p->Range << 8;
    p->Range = uVar3;
    if (uVar3 < 0x1000000) {
      bVar2 = (*p->Stream->Read)(p->Stream);
      p->Code = (uint)bVar2 | uVar4 << 8;
      p->Range = p->Range << 8;
    }
  }
  return;
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  if (p->Range < kTopValue)
  {
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    if (p->Range < kTopValue)
    {
      p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
      p->Range <<= 8;
    }
  }
}